

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_cast.hpp
# Opt level: O2

bool boost::unit_test::utils::string_as<unsigned_long>(const_string *str,unsigned_long *res)

{
  uint uVar1;
  undefined1 *local_1a8 [2];
  undefined1 local_198 [16];
  istringstream buff;
  uint auStack_168 [88];
  
  local_1a8[0] = local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,str->m_begin,str->m_end);
  std::__cxx11::istringstream::istringstream((istringstream *)&buff,(string *)local_1a8,_S_in);
  std::__cxx11::string::~string((string *)local_1a8);
  std::istream::_M_extract<unsigned_long>((ulong *)&buff);
  uVar1 = *(uint *)((long)auStack_168 + *(long *)(_buff + -0x18));
  std::__cxx11::istringstream::~istringstream((istringstream *)&buff);
  return (uVar1 & 7) == 2;
}

Assistant:

inline bool
string_as( const_string str, T& res )
{
    std::istringstream buff( std::string( str.begin(), str.end() ) );
    buff >> res;

    return !buff.fail() && buff.eof();
}